

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdma.cc
# Opt level: O1

void __thiscall bsplib::Rdma::pop_reg(Rdma *this,Memslot id)

{
  uint *puVar1;
  iterator __position;
  Memslot local_8;
  
  local_8 = id;
  if (id != 0xfffffffffffffffe) {
    if (((this->m_used_slots).
         super__Vector_base<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>._M_impl
         .super__Vector_impl_data._M_start[(long)this->m_nprocs * id + (long)this->m_pid].status & 2
        ) != 0) {
      __assert_fail("id == null_slot() || !( slot(m_pid, id ).status & Memblock::POPPED)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/rdma.cc"
                    ,0x41,"void bsplib::Rdma::pop_reg(Memslot)");
    }
    if (id != 0xfffffffffffffffe) {
      puVar1 = &(this->m_used_slots).
                super__Vector_base<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>.
                _M_impl.super__Vector_impl_data._M_start
                [(long)this->m_nprocs * id + (long)this->m_pid].status;
      *puVar1 = *puVar1 | 2;
    }
  }
  __position._M_current =
       (this->m_send_push_pop_comm_buf).m_popped_slots.
       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_send_push_pop_comm_buf).m_popped_slots.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long,std::allocator<unsigned_long>>::
    _M_realloc_insert<unsigned_long_const&>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)
               &(this->m_send_push_pop_comm_buf).m_popped_slots,__position,&local_8);
  }
  else {
    *__position._M_current = id;
    (this->m_send_push_pop_comm_buf).m_popped_slots.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  return;
}

Assistant:

void Rdma::pop_reg( Memslot id )
{
    assert( id == null_slot() || !( slot(m_pid, id ).status & Memblock::POPPED) );
    if ( id != null_slot() ) {
        slot( m_pid, id ).status |= Memblock::POPPED;
    }
    m_send_push_pop_comm_buf.m_popped_slots.push_back( id );
}